

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O0

void rtext_retext(_rtext *x)

{
  t_text *ptVar1;
  char *pcVar2;
  t_text *text;
  int local_18;
  int indx;
  int h;
  int w;
  _rtext *x_local;
  
  indx = 0;
  local_18 = 0;
  ptVar1 = x->x_text;
  _h = x;
  freebytes(x->x_buf,(long)(x->x_bufsize + 1));
  binbuf_gettext(ptVar1->te_binbuf,&_h->x_buf,&_h->x_bufsize);
  pcVar2 = (char *)resizebytes(_h->x_buf,(long)_h->x_bufsize,(long)(_h->x_bufsize + 1));
  _h->x_buf = pcVar2;
  _h->x_buf[_h->x_bufsize] = '\0';
  rtext_senditup(_h,2,&indx,&local_18,(int *)((long)&text + 4));
  return;
}

Assistant:

void rtext_retext(t_rtext *x)
{
    int w = 0, h = 0, indx;
    t_text *text = x->x_text;
    t_freebytes(x->x_buf, x->x_bufsize + 1); /* extra 0 byte */
    binbuf_gettext(text->te_binbuf, &x->x_buf, &x->x_bufsize);
        /* allocate extra space for hidden null terminator */
    x->x_buf = resizebytes(x->x_buf, x->x_bufsize, x->x_bufsize+1);
    x->x_buf[x->x_bufsize] = 0;
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}